

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_pointer.hpp
# Opt level: O1

string_t * __thiscall
nlohmann::json_abi_v3_11_2::
json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
to_string(string_t *__return_storage_ptr__,
         json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *this)

{
  pointer pbVar1;
  pointer b;
  undefined1 local_79;
  string_t local_78;
  string_t *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  b = (this->reference_tokens).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->reference_tokens).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  local_58 = __return_storage_ptr__;
  if (b != pbVar1) {
    do {
      const::{lambda(std::__cxx11::string_const&,std::__cxx11::string_const&)#1}::operator()::
      string_const___const(&local_50,&local_79,&local_78,b);
      std::__cxx11::string::operator=((string *)&local_78,(string *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      b = b + 1;
    } while (b != pbVar1);
  }
  (local_58->_M_dataplus)._M_p = (pointer)&local_58->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p == &local_78.field_2) {
    (local_58->field_2)._M_allocated_capacity =
         CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,local_78.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&local_58->field_2 + 8) = local_78.field_2._8_8_;
  }
  else {
    (local_58->_M_dataplus)._M_p = local_78._M_dataplus._M_p;
    (local_58->field_2)._M_allocated_capacity =
         CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,local_78.field_2._M_local_buf[0]);
  }
  local_58->_M_string_length = local_78._M_string_length;
  return local_58;
}

Assistant:

string_t to_string() const
    {
        return std::accumulate(reference_tokens.begin(), reference_tokens.end(),
                               string_t{},
                               [](const string_t& a, const string_t& b)
        {
            return detail::concat(a, '/', detail::escape(b));
        });
    }